

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

int secp256k1_fe_equal(secp256k1_fe *a,secp256k1_fe *b)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  secp256k1_fe na;
  secp256k1_fe *in_stack_ffffffffffffffb8;
  secp256k1_fe *in_stack_ffffffffffffffc0;
  
  secp256k1_fe_verify(in_stack_ffffffffffffffc0);
  secp256k1_fe_verify(in_stack_ffffffffffffffc0);
  if (1 < *(int *)(in_RDI + 0x28)) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
            ,0x1a,"test condition failed: a->magnitude <= 1");
    abort();
  }
  if (0x1f < *(int *)(in_RSI + 0x28)) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
            ,0x1b,"test condition failed: b->magnitude <= 31");
    abort();
  }
  secp256k1_fe_negate_unchecked(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
  secp256k1_fe_add(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  iVar1 = secp256k1_fe_normalizes_to_zero((secp256k1_fe *)0x11de41);
  return iVar1;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_equal(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe na;
#ifdef VERIFY
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(b);
    VERIFY_CHECK(a->magnitude <= 1);
    VERIFY_CHECK(b->magnitude <= 31);
#endif
    secp256k1_fe_negate(&na, a, 1);
    secp256k1_fe_add(&na, b);
    return secp256k1_fe_normalizes_to_zero(&na);
}